

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition.cc
# Opt level: O0

void __thiscall
transition_guard_moved_into_transition_size_Test::TestBody
          (transition_guard_moved_into_transition_size_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_d0;
  AssertHelper local_b0;
  Message local_a8;
  e2 local_a0;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_68;
  Message local_60;
  e2 local_58;
  bool local_51;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  __0 local_28 [16];
  Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_cc:128:9),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
  local_18;
  Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_cc:128:9),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
  transition;
  transition_guard_moved_into_transition_size_Test *this_local;
  
  transition.super_anon_class_8_1_54a39818.x._M_t.
  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (anon_class_8_1_54a39818)(anon_class_8_1_54a39818)this;
  std::make_unique<int,int_const&>((int *)local_28);
  state_machine::transition::
  make_transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,transition_guard_moved_into_transition_size_Test::TestBody()::__0,state_machine::containers::basic::identity<state_machine::transition::detail::empty>const&,state_machine::containers::basic::identity<state_machine::transition::detail::empty>>
            (&local_18,local_28,&state_machine::placeholder::_);
  TestBody()::$_0::~__0(local_28);
  anon_unknown.dwarf_4d0d::e2::e2(&local_58,0x2a);
  bVar1 = state_machine::transition::
          Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition.cc:128:9),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
          ::guard<(anonymous_namespace)::e2>(&local_18,&local_58);
  local_51 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_50,&local_51,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_50,
               (AssertionResult *)"transition.guard(e2{threshold})","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition.cc"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  anon_unknown.dwarf_4d0d::e2::e2(&local_a0,0x2b);
  local_99 = state_machine::transition::
             Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition.cc:128:9),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
             ::guard<(anonymous_namespace)::e2>(&local_18,&local_a0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d0,(internal *)local_98,
               (AssertionResult *)"transition.guard(e2{threshold + 1})","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition.cc"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  state_machine::transition::
  Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition.cc:128:9),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
  ::~Transition(&local_18);
  return;
}

Assistant:

TEST(transition, guard_moved_into_transition_size) {
    static constexpr int threshold = 42;

    auto transition = make_transition(
        state<s1>,
        event<e2>,
        [x = std::make_unique<int>(threshold)](const e2 e) { return e.value > *x; },
        _,
        _);

    EXPECT_FALSE(transition.guard(e2{threshold}));
    EXPECT_TRUE(transition.guard(e2{threshold + 1}));
}